

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_types.cpp
# Opt level: O2

void duckdb::DuckDBTypesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  LogicalType *type;
  PhysicalType type_00;
  TypeCatalogEntry *pTVar1;
  uint uVar2;
  GlobalTableFunctionState *pGVar3;
  reference pvVar4;
  string *psVar5;
  idx_t iVar6;
  long lVar7;
  iterator iVar8;
  Vector *pVVar9;
  _func_int **pp_Var10;
  _func_int **__n;
  _func_int **pp_Var11;
  string_t *__args;
  ulong index;
  bool bVar12;
  ulong local_258;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_250;
  Value local_248;
  string category;
  vector<duckdb::Value,_true> labels;
  LogicalType local_1b8;
  Value oid_val;
  LogicalType local_160;
  LogicalType local_148;
  LogicalType local_130;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_98 [24];
  LogicalType local_80;
  LogicalType local_68;
  string local_50;
  
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar3[4]._vptr_GlobalTableFunctionState;
  pp_Var10 = pGVar3[1]._vptr_GlobalTableFunctionState;
  pp_Var11 = pGVar3[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)((long)pp_Var11 - (long)pp_Var10 >> 3)) {
    local_250 = (_Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(pGVar3 + 5);
    for (index = 0; (__n < (_func_int **)((long)pp_Var11 - (long)pp_Var10 >> 3) && (index < 0x800));
        index = index + 1) {
      pGVar3[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar4 = vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true>::get<true>
                         ((vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true> *)
                          (pGVar3 + 1),(size_type)__n);
      pTVar1 = pvVar4->_M_data;
      psVar5 = Catalog::GetName_abi_cxx11_
                         ((pTVar1->super_StandardEntry).super_InCatalogEntry.catalog);
      ::std::__cxx11::string::string((string *)&local_b8,(string *)psVar5);
      Value::Value(&oid_val,&local_b8);
      DataChunk::SetValue(output,0,index,&oid_val);
      Value::~Value(&oid_val);
      ::std::__cxx11::string::~string((string *)&local_b8);
      iVar6 = Catalog::GetOid((pTVar1->super_StandardEntry).super_InCatalogEntry.catalog);
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar6);
      Value::BIGINT(&oid_val,lVar7);
      DataChunk::SetValue(output,1,index,&oid_val);
      Value::~Value(&oid_val);
      ::std::__cxx11::string::string
                ((string *)&local_d8,
                 (string *)
                 &(((pTVar1->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.
                  name);
      Value::Value(&oid_val,&local_d8);
      DataChunk::SetValue(output,2,index,&oid_val);
      Value::~Value(&oid_val);
      ::std::__cxx11::string::~string((string *)&local_d8);
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((((pTVar1->super_StandardEntry).schema)->super_InCatalogEntry).
                         super_CatalogEntry.oid);
      Value::BIGINT(&oid_val,lVar7);
      DataChunk::SetValue(output,3,index,&oid_val);
      type = &pTVar1->user_type;
      Value::~Value(&oid_val);
      if ((pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal == true) {
        local_258 = (ulong)type->id_;
      }
      else {
        local_258 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                              ((pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry
                               .oid);
      }
      LogicalType::LogicalType(&local_68,SQLNULL);
      Value::Value(&oid_val,&local_68);
      LogicalType::~LogicalType(&local_68);
      iVar8 = ::std::
              _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(local_250,(key_type_conflict *)&local_258);
      if (iVar8.super__Node_iterator_base<long,_false>._M_cur == (__node_type *)0x0) {
        ::std::__detail::
        _Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_250,(value_type *)&local_258);
        Value::BIGINT(&local_248,local_258);
        Value::operator=(&oid_val,&local_248);
        Value::~Value(&local_248);
      }
      else {
        LogicalType::LogicalType(&local_80,SQLNULL);
        Value::Value(&local_248,&local_80);
        Value::operator=(&oid_val,&local_248);
        Value::~Value(&local_248);
        LogicalType::~LogicalType(&local_80);
      }
      DataChunk::SetValue(output,4,index,&oid_val);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 &(pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
      Value::Value(&local_248,&local_50);
      DataChunk::SetValue(output,5,index,&local_248);
      Value::~Value(&local_248);
      ::std::__cxx11::string::~string((string *)&local_50);
      type_00 = (pTVar1->user_type).physical_type_;
      if (type_00 == INVALID) {
        LogicalType::LogicalType(&local_130,SQLNULL);
        Value::Value(&local_248,&local_130);
      }
      else {
        iVar6 = GetTypeIdSize(type_00);
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar6);
        Value::BIGINT(&local_248,lVar7);
      }
      DataChunk::SetValue(output,6,index,&local_248);
      Value::~Value(&local_248);
      if (type_00 == INVALID) {
        LogicalType::~LogicalType(&local_130);
      }
      EnumUtil::ToString<duckdb::LogicalTypeId>(&local_f8,type->id_);
      Value::Value(&local_248,&local_f8);
      DataChunk::SetValue(output,7,index,&local_248);
      Value::~Value(&local_248);
      ::std::__cxx11::string::~string((string *)&local_f8);
      category._M_dataplus._M_p = (pointer)&category.field_2;
      category._M_string_length = 0;
      category.field_2._M_local_buf[0] = '\0';
      switch(type->id_) {
      case BOOLEAN:
        break;
      case TINYINT:
      case SMALLINT:
      case INTEGER:
      case BIGINT:
      case DECIMAL:
      case FLOAT:
      case DOUBLE:
      case UTINYINT:
      case USMALLINT:
      case UINTEGER:
      case UBIGINT:
      case UHUGEINT:
      case HUGEINT:
        break;
      case DATE:
      case TIME:
      case TIMESTAMP_SEC:
      case TIMESTAMP_MS:
      case TIMESTAMP:
      case TIMESTAMP_NS:
      case INTERVAL:
      case TIMESTAMP_TZ:
      case TIME_TZ:
        break;
      case CHAR:
      case VARCHAR:
        break;
      case BLOB:
      case TIMESTAMP_TZ|SQLNULL:
      case TIME_TZ|SQLNULL:
      case BIT:
      case STRING_LITERAL:
      case INTEGER_LITERAL:
      case VARINT:
      case 0x28:
      case 0x29:
      case TIMESTAMP_TZ|BOOLEAN:
      case TIMESTAMP_TZ|TINYINT:
      case TIMESTAMP_TZ|SMALLINT:
      case TIMESTAMP_TZ|INTEGER:
      case TIMESTAMP_TZ|BIGINT:
      case TIMESTAMP_TZ|DATE:
      case TIMESTAMP_TZ|TIME:
        goto switchD_0156c5ca_caseD_1a;
      default:
        uVar2 = type->id_ - 100;
        if ((uVar2 < 8) && ((0x87U >> (uVar2 & 0x1f) & 1) != 0)) break;
        goto switchD_0156c5ca_caseD_1a;
      }
      ::std::__cxx11::string::assign((char *)&category);
      if (category._M_string_length == 0) {
switchD_0156c5ca_caseD_1a:
        LogicalType::LogicalType(&local_148,SQLNULL);
        bVar12 = true;
        Value::Value(&local_248,&local_148);
      }
      else {
        ::std::__cxx11::string::string((string *)&local_118,(string *)&category);
        Value::Value(&local_248,&local_118);
        bVar12 = false;
      }
      DataChunk::SetValue(output,8,index,&local_248);
      Value::~Value(&local_248);
      if (bVar12) {
        LogicalType::~LogicalType(&local_148);
      }
      else {
        ::std::__cxx11::string::~string((string *)&local_118);
      }
      Value::Value(&local_248,
                   &(pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment);
      DataChunk::SetValue(output,9,index,&local_248);
      Value::~Value(&local_248);
      Value::MAP(&local_248,
                 &(pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags);
      DataChunk::SetValue(output,10,index,&local_248);
      Value::~Value(&local_248);
      Value::BOOLEAN(&local_248,
                     (pTVar1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal)
      ;
      DataChunk::SetValue(output,0xb,index,&local_248);
      Value::~Value(&local_248);
      if ((type->id_ == ENUM) &&
         ((pTVar1->user_type).type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        pVVar9 = EnumType::GetValuesInsertOrder(type);
        __args = (string_t *)pVVar9->data;
        iVar6 = EnumType::GetSize(type);
        labels.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        labels.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        labels.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        while (bVar12 = iVar6 != 0, iVar6 = iVar6 - 1, bVar12) {
          ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
          emplace_back<duckdb::string_t_const&>
                    ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&labels,__args);
          __args = __args + 1;
        }
        LogicalType::LogicalType(&local_1b8,VARCHAR);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  (local_98,&labels.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
        Value::LIST(&local_248,&local_1b8,(vector<duckdb::Value,_true> *)local_98);
        DataChunk::SetValue(output,0xc,index,&local_248);
        Value::~Value(&local_248);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_98);
        LogicalType::~LogicalType(&local_1b8);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&labels);
      }
      else {
        LogicalType::LogicalType(&local_160,SQLNULL);
        Value::Value(&local_248,&local_160);
        DataChunk::SetValue(output,0xc,index,&local_248);
        Value::~Value(&local_248);
        LogicalType::~LogicalType(&local_160);
      }
      ::std::__cxx11::string::~string((string *)&category);
      Value::~Value(&oid_val);
      __n = pGVar3[4]._vptr_GlobalTableFunctionState;
      pp_Var10 = pGVar3[1]._vptr_GlobalTableFunctionState;
      pp_Var11 = pGVar3[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBTypesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBTypesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &type_entry = data.entries[data.offset++].get();
		auto &type = type_entry.user_type;

		// return values:
		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, type_entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(type_entry.catalog.GetOid())));
		// schema_name, LogicalType::VARCHAR
		output.SetValue(col++, count, Value(type_entry.schema.name));
		// schema_oid, LogicalType::BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(type_entry.schema.oid)));
		// type_oid, BIGINT
		int64_t oid;
		if (type_entry.internal) {
			oid = NumericCast<int64_t>(type.id());
		} else {
			oid = NumericCast<int64_t>(type_entry.oid);
		}
		Value oid_val;
		if (data.oids.find(oid) == data.oids.end()) {
			data.oids.insert(oid);
			oid_val = Value::BIGINT(oid);
		} else {
			oid_val = Value();
		}
		output.SetValue(col++, count, oid_val);
		// type_name, VARCHAR
		output.SetValue(col++, count, Value(type_entry.name));
		// type_size, BIGINT
		auto internal_type = type.InternalType();
		output.SetValue(col++, count,
		                internal_type == PhysicalType::INVALID
		                    ? Value()
		                    : Value::BIGINT(NumericCast<int64_t>(GetTypeIdSize(internal_type))));
		// logical_type, VARCHAR
		output.SetValue(col++, count, Value(EnumUtil::ToString(type.id())));
		// type_category, VARCHAR
		string category;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::DECIMAL:
		case LogicalTypeId::FLOAT:
		case LogicalTypeId::DOUBLE:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
		case LogicalTypeId::HUGEINT:
		case LogicalTypeId::UHUGEINT:
			category = "NUMERIC";
			break;
		case LogicalTypeId::DATE:
		case LogicalTypeId::TIME:
		case LogicalTypeId::TIMESTAMP_SEC:
		case LogicalTypeId::TIMESTAMP_MS:
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::INTERVAL:
		case LogicalTypeId::TIME_TZ:
		case LogicalTypeId::TIMESTAMP_TZ:
			category = "DATETIME";
			break;
		case LogicalTypeId::CHAR:
		case LogicalTypeId::VARCHAR:
			category = "STRING";
			break;
		case LogicalTypeId::BOOLEAN:
			category = "BOOLEAN";
			break;
		case LogicalTypeId::STRUCT:
		case LogicalTypeId::LIST:
		case LogicalTypeId::MAP:
		case LogicalTypeId::UNION:
			category = "COMPOSITE";
			break;
		default:
			break;
		}
		output.SetValue(col++, count, category.empty() ? Value() : Value(category));
		// comment, VARCHAR
		output.SetValue(col++, count, Value(type_entry.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(type_entry.tags));
		// internal, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(type_entry.internal));
		// labels, VARCHAR[]
		if (type.id() == LogicalTypeId::ENUM && type.AuxInfo()) {
			auto data = FlatVector::GetData<string_t>(EnumType::GetValuesInsertOrder(type));
			idx_t size = EnumType::GetSize(type);

			vector<Value> labels;
			for (idx_t i = 0; i < size; i++) {
				labels.emplace_back(data[i]);
			}

			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, labels));
		} else {
			output.SetValue(col++, count, Value());
		}

		count++;
	}
	output.SetCardinality(count);
}